

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O1

int inet_pton4(char *src,uchar *dst)

{
  uint uVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  void *pvVar7;
  byte *pbVar8;
  int iVar9;
  uchar tmp [4];
  undefined4 local_3c;
  uint *local_38;
  
  pbVar8 = (byte *)&local_3c;
  local_3c = local_3c & 0xffffff00;
  iVar9 = 0;
  bVar4 = false;
  local_38 = (uint *)dst;
  do {
    cVar2 = *src;
    if (cVar2 == '\0') {
      if (iVar9 < 4) {
        return -0x16;
      }
      *local_38 = local_3c;
      return 0;
    }
    pvVar7 = memchr("0123456789",(int)cVar2,0xb);
    if (pvVar7 == (void *)0x0) {
      if ((cVar2 == '.') && (bVar4)) {
        bVar4 = false;
        if (iVar9 != 4) {
          pbVar8[1] = 0;
          pbVar8 = pbVar8 + 1;
          bVar6 = true;
          goto LAB_0017b538;
        }
        iVar9 = 4;
        goto LAB_0017b507;
      }
LAB_0017b50b:
      bVar6 = false;
    }
    else {
      bVar3 = *pbVar8;
      if (bVar4 && bVar3 == 0) {
LAB_0017b507:
        bVar4 = true;
        bVar6 = false;
      }
      else {
        uVar1 = (int)pvVar7 + -0x1a5d8c + ((uint)bVar3 + (uint)bVar3 * 4) * 2;
        if (0xff < uVar1) goto LAB_0017b50b;
        *pbVar8 = (byte)uVar1;
        bVar5 = !bVar4;
        bVar4 = true;
        bVar6 = true;
        if (bVar5) {
          bVar4 = iVar9 < 4;
          iVar9 = iVar9 + 1;
          bVar6 = bVar4;
        }
      }
    }
LAB_0017b538:
    src = src + 1;
    if (!bVar6) {
      return -0x16;
    }
  } while( true );
}

Assistant:

static int inet_pton4(const char *src, unsigned char *dst) {
  static const char digits[] = "0123456789";
  int saw_digit, octets, ch;
  unsigned char tmp[sizeof(struct in_addr)], *tp;

  saw_digit = 0;
  octets = 0;
  *(tp = tmp) = 0;
  while ((ch = *src++) != '\0') {
    const char *pch;

    if ((pch = strchr(digits, ch)) != NULL) {
      unsigned int nw = *tp * 10 + (pch - digits);

      if (saw_digit && *tp == 0)
        return UV_EINVAL;
      if (nw > 255)
        return UV_EINVAL;
      *tp = nw;
      if (!saw_digit) {
        if (++octets > 4)
          return UV_EINVAL;
        saw_digit = 1;
      }
    } else if (ch == '.' && saw_digit) {
      if (octets == 4)
        return UV_EINVAL;
      *++tp = 0;
      saw_digit = 0;
    } else
      return UV_EINVAL;
  }
  if (octets < 4)
    return UV_EINVAL;
  memcpy(dst, tmp, sizeof(struct in_addr));
  return 0;
}